

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::js::(anonymous_namespace)::MaybeCrossFileRef_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,GeneratorOptions *options,
          FileDescriptor *from_file,Descriptor *to_message)

{
  FileDescriptor *this_00;
  string *psVar1;
  Descriptor *this_01;
  Descriptor *descriptor;
  string local_a8;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  GeneratorOptions *local_28;
  Descriptor *to_message_local;
  FileDescriptor *from_file_local;
  GeneratorOptions *options_local;
  
  local_28 = (GeneratorOptions *)from_file;
  to_message_local = (Descriptor *)options;
  from_file_local = (FileDescriptor *)this;
  options_local = (GeneratorOptions *)__return_storage_ptr__;
  if ((*(int *)(this + 0x44) == 1) &&
     (from_file = Descriptor::file((Descriptor *)from_file),
     options != (GeneratorOptions *)from_file)) {
    this_00 = Descriptor::file((Descriptor *)local_28);
    psVar1 = FileDescriptor::name_abi_cxx11_(this_00);
    anon_unknown_0::ModuleAlias(&local_88,psVar1);
    this_01 = Descriptor::containing_type((Descriptor *)local_28);
    GetNestedMessageName_abi_cxx11_(&local_a8,(_anonymous_namespace_ *)this_01,descriptor);
    std::operator+(&local_68,&local_88,&local_a8);
    std::operator+(&local_48,&local_68,".");
    psVar1 = Descriptor::name_abi_cxx11_((Descriptor *)local_28);
    std::operator+(__return_storage_ptr__,&local_48,psVar1);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_88);
    return __return_storage_ptr__;
  }
  GetMessagePath_abi_cxx11_
            (__return_storage_ptr__,(_anonymous_namespace_ *)from_file_local,local_28,
             (Descriptor *)from_file);
  return __return_storage_ptr__;
}

Assistant:

string MaybeCrossFileRef(const GeneratorOptions& options,
                         const FileDescriptor* from_file,
                         const Descriptor* to_message) {
  if (options.import_style == GeneratorOptions::kImportCommonJs &&
      from_file != to_message->file()) {
    // Cross-file ref in CommonJS needs to use the module alias instead of
    // the global name.
    return ModuleAlias(to_message->file()->name()) +
           GetNestedMessageName(to_message->containing_type()) + "." +
           to_message->name();
  } else {
    // Within a single file we use a full name.
    return GetMessagePath(options, to_message);
  }
}